

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeMakeReady(Vdbe *p,Parse *pParse)

{
  short sVar1;
  int iVar2;
  int iVar3;
  sqlite3 *db;
  Op *pOVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  ushort uVar8;
  long lVar9;
  long lVar10;
  Mem *pMVar11;
  void *pvVar12;
  VdbeCursor **ppVVar13;
  ushort uVar14;
  ushort uVar15;
  long lVar16;
  long lVar17;
  Mem *pMVar18;
  Mem **ppMVar19;
  ushort uVar20;
  ulong uVar21;
  int iVar22;
  size_t __n;
  u64 uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  u64 uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p->pVList = pParse->pVList;
  pParse->pVList = (VList *)0x0;
  db = p->db;
  sVar1 = pParse->nVar;
  iVar2 = pParse->nTab;
  lVar16 = (long)iVar2;
  local_3c = pParse->nMaxArg;
  iVar22 = pParse->nMem + iVar2;
  lVar9 = (long)(p->nOp * 0x18);
  pOVar4 = p->aOp;
  iVar3 = pParse->szOpAlloc;
  resolveP2Values(p,&local_3c);
  if (pParse->isMultiWrite == '\0') {
    uVar14 = 0;
  }
  else {
    uVar14 = (ushort)(pParse->mayAbort != '\0') << 5;
  }
  lVar10 = (long)sVar1;
  iVar22 = iVar22 + (uint)(0 < iVar22 && lVar16 == 0);
  uVar28 = iVar3 - lVar9 & 0xfffffffffffffff8;
  uVar8 = (ushort)*(undefined4 *)&p->field_0xc8;
  uVar15 = uVar14 | uVar8 & 0xffdf;
  *(ushort *)&p->field_0xc8 = uVar15;
  if (pParse->explain != 0) {
    if (iVar22 < 0xb) {
      iVar22 = 10;
    }
    uVar20 = (pParse->explain & 3) << 2;
    uVar15 = uVar14 | uVar8 & 0xffd3 | uVar20;
    p->nResColumn = (ushort)(byte)((byte)uVar20 ^ 0xc);
  }
  *(ushort *)&p->field_0xc8 = uVar15 & 0xfffc;
  lVar17 = (long)iVar22;
  lVar26 = lVar17 * 0x38;
  pMVar18 = (Mem *)0x0;
  uVar21 = uVar28 + lVar17 * -0x38;
  pMVar11 = (Mem *)((long)pOVar4 + uVar21 + lVar9);
  lVar5 = 0;
  if (SBORROW8(uVar28,lVar26) != (long)uVar21 < 0) {
    pMVar11 = pMVar18;
    lVar5 = lVar26;
    uVar21 = uVar28;
  }
  p->aMem = pMVar11;
  lVar25 = lVar10 * 0x38;
  uVar28 = uVar21 + lVar10 * -0x38;
  pMVar11 = (Mem *)((long)pOVar4 + uVar28 + lVar9);
  lVar6 = 0;
  if (SBORROW8(uVar21,lVar25) != (long)uVar28 < 0) {
    pMVar11 = pMVar18;
    lVar6 = lVar25;
    uVar28 = uVar21;
  }
  p->aVar = pMVar11;
  lVar29 = (long)local_3c;
  lVar30 = lVar29 * 8;
  uVar21 = uVar28 + lVar29 * -8;
  lVar24 = 0;
  if ((long)uVar28 < lVar30) {
    lVar24 = lVar30;
  }
  pMVar11 = (Mem *)((long)pOVar4 + uVar21 + lVar9);
  if (SBORROW8(uVar28,lVar30) != (long)uVar21 < 0) {
    pMVar11 = pMVar18;
    uVar21 = uVar28;
  }
  p->apArg = (Mem **)pMVar11;
  __n = lVar16 * 8;
  pMVar11 = (Mem *)((long)pOVar4 + uVar21 + lVar16 * -8 + lVar9);
  sVar7 = 0;
  if ((long)uVar21 < (long)__n) {
    pMVar11 = pMVar18;
    sVar7 = __n;
  }
  p->apCsr = (VdbeCursor **)pMVar11;
  uVar27 = sVar7 + lVar24 + lVar6 + lVar5;
  if (uVar27 == 0) {
    if (db->mallocFailed != '\0') goto LAB_001263d4;
  }
  else {
    pvVar12 = sqlite3DbMallocRawNN(db,uVar27);
    p->pFree = pvVar12;
    if (db->mallocFailed != '\0') {
LAB_001263d4:
      p->nVar = 0;
      p->nMem = 0;
      p->nCursor = 0;
      goto LAB_001264a9;
    }
    pMVar11 = p->aMem;
    if (pMVar11 == (Mem *)0x0) {
      uVar23 = uVar27 + lVar17 * -0x38;
      if ((long)uVar27 < lVar26) {
        pMVar11 = (Mem *)0x0;
      }
      else {
        pMVar11 = (Mem *)((long)pvVar12 + uVar23);
        uVar27 = uVar23;
      }
    }
    p->aMem = pMVar11;
    pMVar11 = p->aVar;
    uVar23 = uVar27;
    if (pMVar11 == (Mem *)0x0) {
      uVar23 = uVar27 + lVar10 * -0x38;
      if ((long)uVar27 < lVar25) {
        pMVar11 = (Mem *)0x0;
        uVar23 = uVar27;
      }
      else {
        pMVar11 = (Mem *)((long)pvVar12 + uVar23);
      }
    }
    p->aVar = pMVar11;
    ppMVar19 = p->apArg;
    uVar27 = uVar23;
    if (ppMVar19 == (Mem **)0x0) {
      uVar27 = uVar23 + lVar29 * -8;
      if ((long)uVar23 < lVar30) {
        ppMVar19 = (Mem **)0x0;
        uVar27 = uVar23;
      }
      else {
        ppMVar19 = (Mem **)((long)pvVar12 + uVar27);
      }
    }
    p->apArg = ppMVar19;
    ppVVar13 = p->apCsr;
    if (ppVVar13 == (VdbeCursor **)0x0) {
      if ((long)uVar27 < (long)__n) {
        ppVVar13 = (VdbeCursor **)0x0;
      }
      else {
        ppVVar13 = (VdbeCursor **)((long)pvVar12 + uVar27 + lVar16 * -8);
      }
    }
    p->apCsr = ppVVar13;
  }
  p->nCursor = iVar2;
  p->nVar = sVar1;
  initMemArray(p->aVar,(int)sVar1,db,1);
  p->nMem = iVar22;
  initMemArray(p->aMem,iVar22,db,0);
  memset(p->apCsr,0,__n);
LAB_001264a9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    sqlite3VdbeRewind(p);
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMakeReady(
  Vdbe *p,                       /* The VDBE */
  Parse *pParse                  /* Parsing context */
){
  sqlite3 *db;                   /* The database connection */
  int nVar;                      /* Number of parameters */
  int nMem;                      /* Number of VM memory registers */
  int nCursor;                   /* Number of cursors required */
  int nArg;                      /* Number of arguments in subprograms */
  int n;                         /* Loop counter */
  struct ReusableSpace x;        /* Reusable bulk memory */

  assert( p!=0 );
  assert( p->nOp>0 );
  assert( pParse!=0 );
  assert( p->eVdbeState==VDBE_INIT_STATE );
  assert( pParse==p->pParse );
  assert( pParse->db==p->db );
  p->pVList = pParse->pVList;
  pParse->pVList =  0;
  db = p->db;
  assert( db->mallocFailed==0 );
  nVar = pParse->nVar;
  nMem = pParse->nMem;
  nCursor = pParse->nTab;
  nArg = pParse->nMaxArg;

  /* Each cursor uses a memory cell.  The first cursor (cursor 0) can
  ** use aMem[0] which is not otherwise used by the VDBE program.  Allocate
  ** space at the end of aMem[] for cursors 1 and greater.
  ** See also: allocateCursor().
  */
  nMem += nCursor;
  if( nCursor==0 && nMem>0 ) nMem++;  /* Space for aMem[0] even if not used */

  /* Figure out how much reusable memory is available at the end of the
  ** opcode array.  This extra memory will be reallocated for other elements
  ** of the prepared statement.
  */
  n = ROUND8P(sizeof(Op)*p->nOp);             /* Bytes of opcode memory used */
  x.pSpace = &((u8*)p->aOp)[n];               /* Unused opcode memory */
  assert( EIGHT_BYTE_ALIGNMENT(x.pSpace) );
  x.nFree = ROUNDDOWN8(pParse->szOpAlloc - n);  /* Bytes of unused memory */
  assert( x.nFree>=0 );
  assert( EIGHT_BYTE_ALIGNMENT(&x.pSpace[x.nFree]) );

  resolveP2Values(p, &nArg);
  p->usesStmtJournal = (u8)(pParse->isMultiWrite && pParse->mayAbort);
  if( pParse->explain ){
    if( nMem<10 ) nMem = 10;
    p->explain = pParse->explain;
    p->nResColumn = 12 - 4*p->explain;
  }
  p->expired = 0;

  /* Memory for registers, parameters, cursor, etc, is allocated in one or two
  ** passes.  On the first pass, we try to reuse unused memory at the
  ** end of the opcode array.  If we are unable to satisfy all memory
  ** requirements by reusing the opcode array tail, then the second
  ** pass will fill in the remainder using a fresh memory allocation.
  **
  ** This two-pass approach that reuses as much memory as possible from
  ** the leftover memory at the end of the opcode array.  This can significantly
  ** reduce the amount of memory held by a prepared statement.
  */
  x.nNeeded = 0;
  p->aMem = allocSpace(&x, 0, nMem*sizeof(Mem));
  p->aVar = allocSpace(&x, 0, nVar*sizeof(Mem));
  p->apArg = allocSpace(&x, 0, nArg*sizeof(Mem*));
  p->apCsr = allocSpace(&x, 0, nCursor*sizeof(VdbeCursor*));
  if( x.nNeeded ){
    x.pSpace = p->pFree = sqlite3DbMallocRawNN(db, x.nNeeded);
    x.nFree = x.nNeeded;
    if( !db->mallocFailed ){
      p->aMem = allocSpace(&x, p->aMem, nMem*sizeof(Mem));
      p->aVar = allocSpace(&x, p->aVar, nVar*sizeof(Mem));
      p->apArg = allocSpace(&x, p->apArg, nArg*sizeof(Mem*));
      p->apCsr = allocSpace(&x, p->apCsr, nCursor*sizeof(VdbeCursor*));
    }
  }

  if( db->mallocFailed ){
    p->nVar = 0;
    p->nCursor = 0;
    p->nMem = 0;
  }else{
    p->nCursor = nCursor;
    p->nVar = (ynVar)nVar;
    initMemArray(p->aVar, nVar, db, MEM_Null);
    p->nMem = nMem;
    initMemArray(p->aMem, nMem, db, MEM_Undefined);
    memset(p->apCsr, 0, nCursor*sizeof(VdbeCursor*));
  }
  sqlite3VdbeRewind(p);
}